

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::entered4(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxId param_1,int n)

{
  int iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  pointer pnVar5;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar6;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar7;
  pointer pnVar8;
  pointer pnVar9;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar10;
  type_conflict5 tVar11;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  double local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<200U,_int,_void> local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  xi_p;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar18 = 0;
  if (-1 < n) {
    pSVar2 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    if (n < (pSVar2->thecovectors->set).thenum) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&delta.m_backend,
                 1.0 / (double)(pSVar2->
                               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).iterCount + 2.0,(type *)0x0);
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      pnVar3 = (this->workVec).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar4 = (pSVar2->coWeights).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar5 = (pSVar2->weights).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pUVar6 = pSVar2->theCoPvec;
      pUVar7 = pSVar2->thePvec;
      pnVar8 = (pUVar7->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar9 = (pUVar6->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_238,&pSVar2->theFvec->thedelta,n);
      xi_p.m_backend.fpclass = cpp_dec_float_finite;
      xi_p.m_backend.prec_elem = 0x1c;
      xi_p.m_backend.data._M_elems[0] = 0;
      xi_p.m_backend.data._M_elems[1] = 0;
      xi_p.m_backend.data._M_elems[2] = 0;
      xi_p.m_backend.data._M_elems[3] = 0;
      xi_p.m_backend.data._M_elems[4] = 0;
      xi_p.m_backend.data._M_elems[5] = 0;
      xi_p.m_backend.data._M_elems[6] = 0;
      xi_p.m_backend.data._M_elems[7] = 0;
      xi_p.m_backend.data._M_elems[8] = 0;
      xi_p.m_backend.data._M_elems[9] = 0;
      xi_p.m_backend.data._M_elems[10] = 0;
      xi_p.m_backend.data._M_elems[0xb] = 0;
      xi_p.m_backend.data._M_elems[0xc] = 0;
      xi_p.m_backend.data._M_elems[0xd] = 0;
      xi_p.m_backend.data._M_elems[0xe] = 0;
      xi_p.m_backend.data._M_elems[0xf] = 0;
      xi_p.m_backend.data._M_elems[0x18] = 0;
      xi_p.m_backend.data._M_elems[0x19] = 0;
      xi_p.m_backend.data._M_elems._104_5_ = 0;
      xi_p.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      xi_p.m_backend.exp = 0;
      xi_p.m_backend.neg = false;
      xi_p.m_backend.data._M_elems[0x10] = 0;
      xi_p.m_backend.data._M_elems[0x11] = 0;
      xi_p.m_backend.data._M_elems[0x12] = 0;
      xi_p.m_backend.data._M_elems[0x13] = 0;
      xi_p.m_backend.data._M_elems[0x14] = 0;
      xi_p.m_backend.data._M_elems[0x15] = 0;
      xi_p.m_backend.data._M_elems[0x16] = 0;
      xi_p.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0] = 1;
      result.m_backend.data._M_elems[1] = 0;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                (&xi_p.m_backend,(longlong *)&result,&local_238);
      local_238.fpclass = cpp_dec_float_finite;
      local_238.prec_elem = 0x1c;
      local_238.data._M_elems[0] = 0;
      local_238.data._M_elems[1] = 0;
      local_238.data._M_elems[2] = 0;
      local_238.data._M_elems[3] = 0;
      local_238.data._M_elems[4] = 0;
      local_238.data._M_elems[5] = 0;
      local_238.data._M_elems[6] = 0;
      local_238.data._M_elems[7] = 0;
      local_238.data._M_elems[8] = 0;
      local_238.data._M_elems[9] = 0;
      local_238.data._M_elems[10] = 0;
      local_238.data._M_elems[0xb] = 0;
      local_238.data._M_elems[0xc] = 0;
      local_238.data._M_elems[0xd] = 0;
      local_238.data._M_elems[0xe] = 0;
      local_238.data._M_elems[0xf] = 0;
      local_238.data._M_elems[0x10] = 0;
      local_238.data._M_elems[0x11] = 0;
      local_238.data._M_elems[0x12] = 0;
      local_238.data._M_elems[0x13] = 0;
      local_238.data._M_elems[0x14] = 0;
      local_238.data._M_elems[0x15] = 0;
      local_238.data._M_elems[0x16] = 0;
      local_238.data._M_elems[0x17] = 0;
      local_238.data._M_elems[0x18] = 0;
      local_238.data._M_elems[0x19] = 0;
      local_238.data._M_elems._104_5_ = 0;
      local_238.data._M_elems[0x1b]._1_3_ = 0;
      local_238.exp = 0;
      local_238.neg = false;
      for (uVar14 = (ulong)(uint)(pUVar6->thedelta).super_IdxSet.num; lVar13 = 0x1c, 0 < (int)uVar14
          ; uVar14 = uVar14 - 1) {
        iVar1 = (pUVar6->thedelta).super_IdxSet.idx[uVar14 - 1];
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&xi_p.m_backend,&pnVar9[iVar1].m_backend);
        pnVar15 = &result;
        pcVar16 = &local_238;
        for (; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar16->data)._M_elems[0] = *(uint *)pnVar15;
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar18 * -8 + 4);
        }
        local_238.exp = result.m_backend.exp;
        local_238.neg = result.m_backend.neg;
        local_238.fpclass = result.m_backend.fpclass;
        local_238.prec_elem = result.m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&local_238,&(this->pi_p).m_backend);
        local_b0.data._M_elems[0] = 0;
        local_b0.data._M_elems[1] = 0x40000000;
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems[0x18] = 0;
        result_2.m_backend.data._M_elems[0x19] = 0;
        result_2.m_backend.data._M_elems._104_5_ = 0;
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  (&result_2.m_backend,&pnVar3[iVar1].m_backend,(double *)&local_b0);
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 0x1c;
        result_3.m_backend.data._M_elems[0] = 0;
        result_3.m_backend.data._M_elems[1] = 0;
        result_3.m_backend.data._M_elems[2] = 0;
        result_3.m_backend.data._M_elems[3] = 0;
        result_3.m_backend.data._M_elems[4] = 0;
        result_3.m_backend.data._M_elems[5] = 0;
        result_3.m_backend.data._M_elems[6] = 0;
        result_3.m_backend.data._M_elems[7] = 0;
        result_3.m_backend.data._M_elems[8] = 0;
        result_3.m_backend.data._M_elems[9] = 0;
        result_3.m_backend.data._M_elems[10] = 0;
        result_3.m_backend.data._M_elems[0xb] = 0;
        result_3.m_backend.data._M_elems[0xc] = 0;
        result_3.m_backend.data._M_elems[0xd] = 0;
        result_3.m_backend.data._M_elems[0xe] = 0;
        result_3.m_backend.data._M_elems[0xf] = 0;
        result_3.m_backend.data._M_elems[0x10] = 0;
        result_3.m_backend.data._M_elems[0x11] = 0;
        result_3.m_backend.data._M_elems[0x12] = 0;
        result_3.m_backend.data._M_elems[0x13] = 0;
        result_3.m_backend.data._M_elems[0x14] = 0;
        result_3.m_backend.data._M_elems[0x15] = 0;
        result_3.m_backend.data._M_elems[0x16] = 0;
        result_3.m_backend.data._M_elems[0x17] = 0;
        result_3.m_backend.data._M_elems[0x18] = 0;
        result_3.m_backend.data._M_elems[0x19] = 0;
        result_3.m_backend.data._M_elems._104_5_ = 0;
        result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_3.m_backend,&result_1.m_backend,&result_2.m_backend);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&local_238,&result_3.m_backend);
        pcVar16 = &pnVar4[iVar1].m_backend;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (pcVar16,&result.m_backend);
        tVar11 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)pcVar16,&delta);
        if (tVar11) {
          pnVar15 = &delta;
          pcVar17 = pcVar16;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar17->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar18 * -8 + 4);
          }
          pcVar16->exp = delta.m_backend.exp;
          pcVar16->neg = delta.m_backend.neg;
          result.m_backend._120_8_ = delta.m_backend._120_8_;
LAB_0043f0b2:
          pcVar16->fpclass = result.m_backend.fpclass;
          pcVar16->prec_elem = result.m_backend.prec_elem;
        }
        else {
          pdVar12 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,*pdVar12,(type *)0x0);
          tVar11 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar16,&result);
          lVar13 = 0x1c;
          if (tVar11) {
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::epsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&result_3.m_backend,
                      (this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver);
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            result_1.m_backend.data._M_elems[0] = 1;
            result_1.m_backend.data._M_elems[1] = 0;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                      (&result.m_backend,(longlong *)&result_1,&result_3.m_backend);
            pnVar15 = &result;
            pcVar17 = pcVar16;
            for (; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar17->data)._M_elems[0] = *(uint *)pnVar15;
              pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar18 * -8 + 4);
            }
            pcVar16->exp = result.m_backend.exp;
            pcVar16->neg = result.m_backend.neg;
            goto LAB_0043f0b2;
          }
        }
      }
      for (uVar14 = (ulong)(uint)(pUVar7->thedelta).super_IdxSet.num; lVar13 = 0x1c, 0 < (int)uVar14
          ; uVar14 = uVar14 - 1) {
        iVar1 = (pUVar7->thedelta).super_IdxSet.idx[uVar14 - 1];
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&xi_p.m_backend,&pnVar8[iVar1].m_backend);
        pnVar15 = &result;
        pcVar16 = &local_238;
        for (; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar16->data)._M_elems[0] = *(uint *)pnVar15;
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar18 * -8 + 4);
        }
        local_238.exp = result.m_backend.exp;
        local_238.neg = result.m_backend.neg;
        local_238.fpclass = result.m_backend.fpclass;
        local_238.prec_elem = result.m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&local_238,&(this->pi_p).m_backend);
        local_3c0 = 2.0;
        pSVar10 = ((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->thevectors;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator*((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_b0,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((pSVar10->set).theitem + (pSVar10->set).thekey[iVar1].idx),
                    &(this->workVec).
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems[0x18] = 0;
        result_2.m_backend.data._M_elems[0x19] = 0;
        result_2.m_backend.data._M_elems._104_5_ = 0;
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  (&result_2.m_backend,&local_b0,&local_3c0);
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 0x1c;
        result_3.m_backend.data._M_elems[0] = 0;
        result_3.m_backend.data._M_elems[1] = 0;
        result_3.m_backend.data._M_elems[2] = 0;
        result_3.m_backend.data._M_elems[3] = 0;
        result_3.m_backend.data._M_elems[4] = 0;
        result_3.m_backend.data._M_elems[5] = 0;
        result_3.m_backend.data._M_elems[6] = 0;
        result_3.m_backend.data._M_elems[7] = 0;
        result_3.m_backend.data._M_elems[8] = 0;
        result_3.m_backend.data._M_elems[9] = 0;
        result_3.m_backend.data._M_elems[10] = 0;
        result_3.m_backend.data._M_elems[0xb] = 0;
        result_3.m_backend.data._M_elems[0xc] = 0;
        result_3.m_backend.data._M_elems[0xd] = 0;
        result_3.m_backend.data._M_elems[0xe] = 0;
        result_3.m_backend.data._M_elems[0xf] = 0;
        result_3.m_backend.data._M_elems[0x10] = 0;
        result_3.m_backend.data._M_elems[0x11] = 0;
        result_3.m_backend.data._M_elems[0x12] = 0;
        result_3.m_backend.data._M_elems[0x13] = 0;
        result_3.m_backend.data._M_elems[0x14] = 0;
        result_3.m_backend.data._M_elems[0x15] = 0;
        result_3.m_backend.data._M_elems[0x16] = 0;
        result_3.m_backend.data._M_elems[0x17] = 0;
        result_3.m_backend.data._M_elems[0x18] = 0;
        result_3.m_backend.data._M_elems[0x19] = 0;
        result_3.m_backend.data._M_elems._104_5_ = 0;
        result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_3.m_backend,&result_1.m_backend,&result_2.m_backend);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result.m_backend,&local_238,&result_3.m_backend);
        pcVar16 = &pnVar5[iVar1].m_backend;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (pcVar16,&result.m_backend);
        tVar11 = boost::multiprecision::operator<
                           ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)pcVar16,&delta);
        if (tVar11) {
          pnVar15 = &delta;
          pcVar17 = pcVar16;
          for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar17->data)._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
            pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar18 * -8 + 4);
          }
          pcVar16->exp = delta.m_backend.exp;
          pcVar16->neg = delta.m_backend.neg;
          result.m_backend._120_8_ = delta.m_backend._120_8_;
LAB_0043f4a1:
          pcVar16->fpclass = result.m_backend.fpclass;
          pcVar16->prec_elem = result.m_backend.prec_elem;
        }
        else {
          pdVar12 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result.m_backend,*pdVar12,(type *)0x0);
          tVar11 = boost::multiprecision::operator>
                             ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar16,&result);
          lVar13 = 0x1c;
          if (tVar11) {
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0x3ff00000;
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::epsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&result_3.m_backend,
                      (this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver);
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                      (&result.m_backend,(double *)&result_1,&result_3.m_backend);
            pnVar15 = &result;
            pcVar17 = pcVar16;
            for (; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar17->data)._M_elems[0] = *(uint *)pnVar15;
              pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar18 * -8 + 4);
            }
            pcVar16->exp = result.m_backend.exp;
            pcVar16->neg = result.m_backend.neg;
            goto LAB_0043f4a1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::entered4(SPxId /* id */, int n)
{
   assert(this->thesolver->type() == SPxSolverBase<R>::ENTER);

   if(n >= 0 && n < this->thesolver->dim())
   {
      R delta = 2 + 1.0 / this->thesolver->basis().iteration();
      R* coWeights_ptr = this->thesolver->coWeights.get_ptr();
      R* weights_ptr = this->thesolver->weights.get_ptr();
      const R* workVec_ptr = workVec.get_const_ptr();
      const R* pVec = this->thesolver->pVec().delta().values();
      const IdxSet& pIdx = this->thesolver->pVec().idx();
      const R* coPvec = this->thesolver->coPvec().delta().values();
      const IdxSet& coPidx = this->thesolver->coPvec().idx();
      R xi_p = 1 / this->thesolver->fVec().delta()[n];
      int i, j;
      R xi_ip;

      assert(this->thesolver->fVec().delta()[n] > this->thesolver->epsilon()
             || this->thesolver->fVec().delta()[n] < -this->thesolver->epsilon());

      for(j = coPidx.size() - 1; j >= 0; --j)
      {
         i = coPidx.index(j);
         xi_ip = xi_p * coPvec[i];
         coWeights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * workVec_ptr[i]);

         /*
           if(coWeights_ptr[i] < 1)
           coWeights_ptr[i] = 1 / (2-x);
         */
         if(coWeights_ptr[i] < delta)
            coWeights_ptr[i] = delta;
         // coWeights_ptr[i] = 1;
         else if(coWeights_ptr[i] > R(infinity))
            coWeights_ptr[i] = 1 / this->thesolver->epsilon();
      }

      for(j = pIdx.size() - 1; j >= 0; --j)
      {
         i = pIdx.index(j);
         xi_ip = xi_p * pVec[i];
         weights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * (this->thesolver->vector(i) * workVec));

         /*
           if(weights_ptr[i] < 1)
           weights_ptr[i] = 1 / (2-x);
         */
         if(weights_ptr[i] < delta)
            weights_ptr[i] = delta;
         // weights_ptr[i] = 1;
         else if(weights_ptr[i] > R(infinity))
            weights_ptr[i] = 1.0 / this->thesolver->epsilon();
      }
   }

   /*@
     if(this->thesolver->isId(id))
     weights[   this->thesolver->number(id) ] *= 1.0001;
     else if(this->thesolver->isCoId(id))
     coWeights[ this->thesolver->number(id) ] *= 1.0001;
   */

}